

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::fixXfbOffsets(TParseContext *this,TQualifier *qualifier,TTypeList *typeList)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  pointer pTVar4;
  undefined4 extraout_var;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool contains16BitType;
  bool contains32BitType;
  bool contains64BitType;
  bool local_43;
  bool local_42;
  bool local_41;
  TQualifier *local_40;
  TParseContext *local_38;
  
  uVar6 = (uint)*(undefined8 *)&qualifier->field_0x24;
  uVar1 = ~uVar6;
  if ((uVar1 & 0x7ffc0000) != 0 && (uVar1 & 0xf) != 0) {
    pTVar4 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
             ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_40 = qualifier;
    if ((typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar4) {
      uVar6 = uVar6 >> 0x12;
      uVar1 = 1;
      uVar7 = 0;
      local_38 = this;
      do {
        iVar2 = (*(pTVar4[uVar7].type)->_vptr_TType[10])();
        local_41 = false;
        local_42 = false;
        local_43 = false;
        uVar3 = TIntermediate::computeTypeXfbSize
                          ((local_38->super_TParseContextBase).super_TParseVersions.intermediate,
                           (typeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar7].type,&local_41,&local_42
                           ,&local_43);
        uVar7 = *(ulong *)(CONCAT44(extraout_var,iVar2) + 0x24);
        uVar5 = (uint)uVar7;
        if ((~uVar5 & 0x7ffc0000) == 0) {
          if (local_41 == true) {
            uVar6 = uVar6 + 7 & 0xfffffff8;
          }
          else if (local_42 == true) {
            uVar6 = uVar6 + 3 & 0xfffffffc;
          }
          else if (local_43 == true) {
            uVar6 = uVar6 + 1 & 0xfffffffe;
          }
          *(ulong *)(CONCAT44(extraout_var,iVar2) + 0x24) =
               uVar7 & 0xffffffff8003ffff | (ulong)((uVar6 & 0x1fff) << 0x12);
        }
        else {
          uVar6 = uVar5 >> 0x12;
        }
        uVar6 = uVar6 + uVar3;
        uVar7 = (ulong)uVar1;
        pTVar4 = (typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar1 = uVar1 + 1;
      } while (uVar7 < (ulong)((long)(typeList->
                                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ).
                                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 5)
              );
    }
    *(ushort *)&local_40->field_0x26 = *(ushort *)&local_40->field_0x26 | 0x7ffc;
  }
  return;
}

Assistant:

void TParseContext::fixXfbOffsets(TQualifier& qualifier, TTypeList& typeList)
{
    // "If a block is qualified with xfb_offset, all its
    // members are assigned transform feedback buffer offsets. If a block is not qualified with xfb_offset, any
    // members of that block not qualified with an xfb_offset will not be assigned transform feedback buffer
    // offsets."

    if (! qualifier.hasXfbBuffer() || ! qualifier.hasXfbOffset())
        return;

    int nextOffset = qualifier.layoutXfbOffset;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        bool contains64BitType = false;
        bool contains32BitType = false;
        bool contains16BitType = false;
        int memberSize = intermediate.computeTypeXfbSize(*typeList[member].type, contains64BitType, contains32BitType, contains16BitType);
        // see if we need to auto-assign an offset to this member
        if (! memberQualifier.hasXfbOffset()) {
            // "if applied to an aggregate containing a double or 64-bit integer, the offset must also be a multiple of 8"
            if (contains64BitType)
                RoundToPow2(nextOffset, 8);
            else if (contains32BitType)
                RoundToPow2(nextOffset, 4);
            else if (contains16BitType)
                RoundToPow2(nextOffset, 2);
            memberQualifier.layoutXfbOffset = nextOffset;
        } else
            nextOffset = memberQualifier.layoutXfbOffset;
        nextOffset += memberSize;
    }

    // The above gave all block members an offset, so we can take it off the block now,
    // which will avoid double counting the offset usage.
    qualifier.layoutXfbOffset = TQualifier::layoutXfbOffsetEnd;
}